

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
               (CodedInputStream *input,int32 *value)

{
  uint32 *puVar1;
  bool bVar2;
  uint32 temp;
  uint32 local_c;
  
  puVar1 = (uint32 *)input->buffer_;
  if (*(int *)&input->buffer_end_ - (int)puVar1 < 4) {
    bVar2 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_c);
  }
  else {
    local_c = *puVar1;
    input->buffer_ = (uint8 *)(puVar1 + 1);
    bVar2 = true;
  }
  if (bVar2 != false) {
    *value = local_c;
  }
  return bVar2;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32, WireFormatLite::TYPE_SFIXED32>(
    io::CodedInputStream* input,
    int32* value) {
  uint32 temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = static_cast<int32>(temp);
  return true;
}